

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

aiMesh * __thiscall Assimp::ColladaLoader::findMesh(ColladaLoader *this,string *meshid)

{
  char *pcVar1;
  aiMesh *paVar2;
  long *plVar3;
  int iVar4;
  size_t sVar5;
  pointer ppaVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  long *local_58;
  size_t local_50;
  long local_48 [2];
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *local_38;
  
  ppaVar6 = (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar6) {
    local_38 = &this->mMeshes;
    uVar7 = 0;
    uVar8 = 1;
    do {
      paVar2 = ppaVar6[uVar7];
      pcVar1 = (paVar2->mName).data;
      local_58 = local_48;
      sVar5 = strlen(pcVar1);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,pcVar1,(paVar2->mName).data + sVar5);
      plVar3 = local_58;
      if (local_50 == meshid->_M_string_length) {
        if (local_50 == 0) {
          bVar9 = true;
        }
        else {
          iVar4 = bcmp(local_58,(meshid->_M_dataplus)._M_p,local_50);
          bVar9 = iVar4 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if (plVar3 != local_48) {
        operator_delete(plVar3,local_48[0] + 1);
      }
      if (bVar9) goto LAB_003a9b27;
      ppaVar6 = (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar9 = uVar8 < (ulong)((long)(this->mMeshes).
                                    super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)ppaVar6 >> 3);
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar9);
  }
  ppaVar6 = (this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar6) {
    local_38 = &this->mTargetMeshes;
    uVar7 = 0;
    uVar8 = 1;
    do {
      paVar2 = ppaVar6[uVar7];
      pcVar1 = (paVar2->mName).data;
      local_58 = local_48;
      sVar5 = strlen(pcVar1);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,pcVar1,(paVar2->mName).data + sVar5);
      plVar3 = local_58;
      if (local_50 == meshid->_M_string_length) {
        if (local_50 == 0) {
          bVar9 = true;
        }
        else {
          iVar4 = bcmp(local_58,(meshid->_M_dataplus)._M_p,local_50);
          bVar9 = iVar4 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if (plVar3 != local_48) {
        operator_delete(plVar3,local_48[0] + 1);
      }
      if (bVar9) {
LAB_003a9b27:
        return (local_38->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar7];
      }
      ppaVar6 = (this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar9 = uVar8 < (ulong)((long)(this->mTargetMeshes).
                                    super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)ppaVar6 >> 3);
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar9);
  }
  return (aiMesh *)0x0;
}

Assistant:

aiMesh *ColladaLoader::findMesh(const std::string& meshid) {
    for (unsigned int i = 0; i < mMeshes.size(); ++i) {
        if (std::string(mMeshes[i]->mName.data) == meshid) {
            return mMeshes[i];
        }
    }

    for (unsigned int i = 0; i < mTargetMeshes.size(); ++i) {
        if (std::string(mTargetMeshes[i]->mName.data) == meshid) {
            return mTargetMeshes[i];
        }
    }

    return nullptr;
}